

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

xmlSchemaTypePtr xmlSchemaGetPrimitiveType(xmlSchemaTypePtr type)

{
  for (; ((type != (xmlSchemaTypePtr)0x0 && (type->builtInType != 0x2e)) &&
         ((type->flags & 0x4000) == 0)); type = type->baseType) {
  }
  return type;
}

Assistant:

static xmlSchemaTypePtr
xmlSchemaGetPrimitiveType(xmlSchemaTypePtr type)
{

    while (type != NULL) {
	/*
	* Note that anySimpleType is actually not a primitive type
	* but we need that here.
	*/
	if ((type->builtInType == XML_SCHEMAS_ANYSIMPLETYPE) ||
	   (type->flags & XML_SCHEMAS_TYPE_BUILTIN_PRIMITIVE))
	    return (type);
	type = type->baseType;
    }

    return (NULL);
}